

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_address.cpp
# Opt level: O2

int __thiscall zmq::ipc_address_t::to_string(ipc_address_t *this,string *addr_)

{
  char *pcVar1;
  int iVar2;
  size_t __n;
  char *__dest;
  char *__string;
  char buf [115];
  
  if ((this->_address).sun_family == 1) {
    __dest = buf + 6;
    builtin_strncpy(buf,"ipc://",6);
    pcVar1 = (this->_address).sun_path;
    __string = pcVar1;
    if (((this->_address).sun_path[0] == '\0') && ((this->_address).sun_path[1] != '\0')) {
      __dest = buf + 7;
      buf[6] = '@';
      __string = (this->_address).sun_path + 1;
    }
    __n = strnlen(__string,(size_t)(pcVar1 + ((ulong)this->_addrlen - (long)__string) + -2));
    memcpy(__dest,__string,__n);
    std::__cxx11::string::assign((char *)addr_,(ulong)buf);
    iVar2 = 0;
  }
  else {
    addr_->_M_string_length = 0;
    *(addr_->_M_dataplus)._M_p = '\0';
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int zmq::ipc_address_t::to_string (std::string &addr_) const
{
    if (_address.sun_family != AF_UNIX) {
        addr_.clear ();
        return -1;
    }

    const char prefix[] = "ipc://";
    char buf[sizeof prefix + sizeof _address.sun_path];
    char *pos = buf;
    memcpy (pos, prefix, sizeof prefix - 1);
    pos += sizeof prefix - 1;
    const char *src_pos = _address.sun_path;
    if (!_address.sun_path[0] && _address.sun_path[1]) {
        *pos++ = '@';
        src_pos++;
    }
    // according to http://man7.org/linux/man-pages/man7/unix.7.html, NOTES
    // section, address.sun_path might not always be null-terminated; therefore,
    // we calculate the length based of addrlen
    const size_t src_len =
      strnlen (src_pos, _addrlen - offsetof (sockaddr_un, sun_path)
                          - (src_pos - _address.sun_path));
    memcpy (pos, src_pos, src_len);
    addr_.assign (buf, pos - buf + src_len);
    return 0;
}